

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_127536a::TLL::HandleLibrary
          (TLL *this,ProcessingState currentProcessingState,string *lib,cmTargetLinkLibraryType llt)

{
  uint uVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  cmListFileContext *lfc;
  ostream *poVar6;
  string *psVar7;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar8;
  size_type sVar9;
  cmake *this_01;
  cmValue cVar10;
  PolicyID extraout_EDX;
  PolicyID id;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id_00;
  char *pcVar11;
  char *pcVar12;
  string *dc;
  pointer b;
  pointer pbVar13;
  allocator<char> local_201;
  string *local_200;
  cmTargetLinkLibraryType local_1f4;
  string local_1f0;
  MessageType local_1cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  ostringstream e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  local_200 = lib;
  local_1f4 = llt;
  TVar4 = cmTarget::GetType(this->Target);
  if ((currentProcessingState != ProcessingKeywordLinkInterface) && (TVar4 == INTERFACE_LIBRARY)) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator<char> *)&local_1f0);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
    goto LAB_00399f8d;
  }
  bVar3 = cmTarget::IsImported(this->Target);
  if ((currentProcessingState != ProcessingKeywordLinkInterface) && (bVar3)) {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator<char> *)&local_1f0);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
    goto LAB_00399f8d;
  }
  pcVar8 = this->Target;
  cmMakefile::GetBacktrace((cmMakefile *)&e);
  lfc = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&e);
  uVar1 = currentProcessingState - ProcessingKeywordLinkInterface;
  bVar3 = cmTarget::PushTLLCommandTrace(pcVar8,(uint)(4 < uVar1),lfc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  id_00 = extraout_EDX;
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0023,false);
    if (PVar5 - NEW < 3) {
      pcVar12 = "must";
      local_1cc = FATAL_ERROR;
      bVar3 = true;
LAB_0039a07b:
      poVar6 = std::operator<<((ostream *)&e,"The ");
      pcVar11 = "keyword";
      if (uVar1 < 5) {
        pcVar11 = "plain";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      poVar6 = std::operator<<(poVar6,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\".  All uses of target_link_libraries with a target ");
      poVar6 = std::operator<<(poVar6,pcVar12);
      std::operator<<(poVar6," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces(this->Target,(ostream *)&e,(uint)(uVar1 < 5));
      pcVar2 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,local_1cc,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      if (bVar3) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return false;
      }
    }
    else if (PVar5 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x17,id);
      poVar6 = std::operator<<((ostream *)&e,(string *)&local_1f0);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_1f0);
      pcVar12 = "should";
      bVar3 = false;
      local_1cc = AUTHOR_WARNING;
      goto LAB_0039a07b;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    id_00 = extraout_EDX_00;
  }
  if (currentProcessingState - ProcessingPlainPublicInterface < 0xfffffffe) {
    pcVar2 = this->Makefile;
    if (this->RejectRemoteLinking == true) {
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char_const(&)[30],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[96]>
                ((string *)&e,(char (*) [30])"Attempt to add link library \"",local_200,
                 (char (*) [14])"\" to target \"",psVar7,
                 (char (*) [96])
                 "\" which is not built in this directory.\nThis is allowed only when policy CMP0079 is set to NEW."
                );
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
LAB_00399f8d:
      std::__cxx11::string::~string((string *)&e);
      return false;
    }
    this_00 = cmMakefile::GetGlobalGenerator(pcVar2);
    pcVar8 = cmGlobalGenerator::FindTarget(this_00,local_200,false);
    if (((((pcVar8 != (cmTarget *)0x0) &&
          (TVar4 = cmTarget::GetType(pcVar8), TVar4 != STATIC_LIBRARY)) &&
         (TVar4 = cmTarget::GetType(pcVar8), TVar4 != SHARED_LIBRARY)) &&
        ((TVar4 = cmTarget::GetType(pcVar8), TVar4 != UNKNOWN_LIBRARY &&
         (TVar4 = cmTarget::GetType(pcVar8), TVar4 != OBJECT_LIBRARY)))) &&
       ((TVar4 = cmTarget::GetType(pcVar8), TVar4 != INTERFACE_LIBRARY &&
        (bVar3 = cmTarget::IsExecutableWithExports(pcVar8), !bVar3)))) {
      pcVar2 = this->Makefile;
      TVar4 = cmTarget::GetType(pcVar8);
      psVar7 = cmState::GetTargetTypeName_abi_cxx11_(TVar4);
      cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string_const&,char_const(&)[115],char_const(&)[50]>
                ((string *)&e,(char (*) [9])0x725759,local_200,(char (*) [11])"\" of type ",psVar7,
                 (char (*) [115])
                 " may not be linked into another target. One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to "
                 ,(char (*) [50])0x74b7af);
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"LINK_LIBRARIES",(allocator<char> *)&local_1f0);
    AffectsProperty(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    cmTarget::AddLinkLibrary(this->Target,this->Makefile,local_200,local_1f4);
    id_00 = extraout_EDX_01;
  }
  if (this->WarnRemoteInterface == true) {
    pcVar2 = this->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x4f,id_00);
    psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<std::__cxx11::string,char_const(&)[11],std::__cxx11::string_const&,char_const(&)[100],std::__cxx11::string_const&,char_const(&)[107]>
              ((string *)&e,&local_1f0,(char (*) [11])"\nTarget\n  ",psVar7,
               (char (*) [100])
               "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
               ,local_200,
               (char (*) [107])
               "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
              );
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  if (currentProcessingState - ProcessingPlainPrivateInterface < 2) {
    TVar4 = cmTarget::GetType(this->Target);
    if ((TVar4 != STATIC_LIBRARY) &&
       (TVar4 = cmTarget::GetType(this->Target), TVar4 != OBJECT_LIBRARY)) {
      return true;
    }
    psVar7 = local_200;
    cmTarget::GetDebugGeneratorExpressions((string *)&e,this->Target,local_200,local_1f4);
    bVar3 = cmGeneratorExpression::IsValidTargetName(psVar7);
    if ((bVar3) || (sVar9 = cmGeneratorExpression::Find(local_200), sVar9 != 0xffffffffffffffff)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &debugConfigs,"$<LINK_ONLY:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      std::operator+(&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &debugConfigs,">");
      std::__cxx11::string::operator=((string *)&e,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&debugConfigs);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"INTERFACE_LINK_LIBRARIES",(allocator<char> *)&debugConfigs);
    AppendProperty(this,&local_1f0,(string *)&e);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&e);
    return true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"INTERFACE_LINK_LIBRARIES",(allocator<char> *)&debugConfigs);
  cmTarget::GetDebugGeneratorExpressions(&local_1f0,this->Target,local_200,local_1f4);
  AppendProperty(this,(string *)&e,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&e);
  if (currentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  PVar5 = cmTarget::GetPolicyStatusCMP0022(this->Target);
  if (PVar5 < NEW) {
    TVar4 = cmTarget::GetType(this->Target);
    if (TVar4 != INTERFACE_LIBRARY) {
      this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
      cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,this_01);
      pbVar13 = debugConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      _e = (pointer)local_198;
      local_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_198[0]._M_local_buf[0] = '\0';
      if (local_1f4 < OPTIMIZED_LibraryType) {
        for (b = debugConfigs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; b != pbVar13; b = b + 1) {
          cmStrCat<char_const(&)[26],std::__cxx11::string_const&>
                    (&local_1f0,(char (*) [26])0x76345a,b);
          std::__cxx11::string::operator=((string *)&e,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          AppendProperty(this,(string *)&e,local_200);
        }
      }
      if ((local_1f4 & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"LINK_INTERFACE_LIBRARIES",&local_201);
        AppendProperty(this,&local_1f0,local_200);
        std::__cxx11::string::~string((string *)&local_1f0);
        local_200 = debugConfigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = debugConfigs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar13 != local_200;
            pbVar13 = pbVar13 + 1) {
          cmStrCat<char_const(&)[26],std::__cxx11::string_const&>
                    (&local_1f0,(char (*) [26])0x76345a,pbVar13);
          std::__cxx11::string::operator=((string *)&e,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          cVar10 = cmTarget::GetProperty(this->Target,(string *)&e);
          if (cVar10.Value == (string *)0x0) {
            pcVar8 = this->Target;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_201);
            cmTarget::SetProperty(pcVar8,(string *)&e,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
          }
        }
      }
      std::__cxx11::string::~string((string *)&e);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugConfigs);
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool TLL::HandleLibrary(ProcessingState currentProcessingState,
                        const std::string& lib, cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (currentProcessingState == ProcessingPlainPrivateInterface ||
     currentProcessingState == ProcessingPlainPublicInterface ||
     currentProcessingState == ProcessingKeywordPrivateInterface ||
     currentProcessingState == ProcessingKeywordPublicInterface ||
     currentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile.GetBacktrace().Top())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile.GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (currentProcessingState != ProcessingKeywordLinkInterface &&
      currentProcessingState != ProcessingPlainLinkInterface) {

    if (this->RejectRemoteLinking) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Attempt to add link library \"", lib, "\" to target \"",
                 this->Target->GetName(),
                 "\" which is not built in this "
                 "directory.\nThis is allowed only when policy CMP0079 "
                 "is set to NEW."));
      return false;
    }

    cmTarget* tgt = this->Makefile.GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "Target \"", lib, "\" of type ",
          cmState::GetTargetTypeName(tgt->GetType()),
          " may not be linked into another target. One may link only to "
          "INTERFACE, OBJECT, STATIC or SHARED libraries, or to ",
          "executables with the ENABLE_EXPORTS property set."));
    }

    this->AffectsProperty("LINK_LIBRARIES");
    this->Target->AddLinkLibrary(this->Makefile, lib, llt);
  }

  if (this->WarnRemoteInterface) {
    this->Makefile.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0079), "\nTarget\n  ",
        this->Target->GetName(),
        "\nis not created in this "
        "directory.  For compatibility with older versions of CMake, link "
        "library\n  ",
        lib,
        "\nwill be looked up in the directory in which "
        "the target was created rather than in this calling directory."));
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (currentProcessingState == ProcessingKeywordPrivateInterface ||
      currentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // TODO: Detect and no-op `$<COMPILE_ONLY>` genexes here.
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(lib, llt);
      if (cmGeneratorExpression::IsValidTargetName(lib) ||
          cmGeneratorExpression::Find(lib) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->AppendProperty("INTERFACE_LINK_LIBRARIES", configLib);
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->AppendProperty("INTERFACE_LINK_LIBRARIES",
                       this->Target->GetDebugGeneratorExpressions(lib, llt));

  // Stop processing if called without any keyword.
  if (currentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile.GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        this->AppendProperty(prop, lib);
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->AppendProperty("LINK_INTERFACE_LIBRARIES", lib);

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}